

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexRuntime.cpp
# Opt level: O1

bool __thiscall
UnifiedRegex::ChompCharGroupInst<(UnifiedRegex::ChompMode)0>::Exec
          (ChompCharGroupInst<(UnifiedRegex::ChompMode)0> *this,Matcher *matcher,Char *input,
          CharCount inputLength,CharCount *matchStart,CharCount *inputOffset,
          CharCount *nextSyncInputOffset,uint8 **instPointer,ContStack *contStack,
          AssertionStack *assertionStack,uint *qcTicks,bool firstIteration)

{
  Char CVar1;
  int iVar2;
  Type TVar3;
  Type pRVar4;
  PageAllocation *pPVar5;
  size_t sVar6;
  GroupInfo *pGVar7;
  code *pcVar8;
  bool bVar9;
  undefined4 *puVar10;
  uint uVar11;
  long lVar12;
  
  iVar2 = (this->super_GroupMixin).groupId;
  if (((long)iVar2 < 0) || ((int)(uint)((matcher->program).ptr)->numGroups <= iVar2)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar10 = 1;
    bVar9 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexRuntime.h"
                       ,0x782,"(groupId >= 0 && groupId < program->numGroups)",
                       "groupId >= 0 && groupId < program->numGroups");
    if (!bVar9) goto LAB_00f03456;
    *puVar10 = 0;
  }
  if ((matcher->groupInfos).ptr[iVar2].length != 0xffffffff) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar10 = 1;
    bVar9 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexRuntime.cpp"
                       ,0xf30,"(matcher.GroupIdToGroupInfo(groupId)->IsUndefined())",
                       "matcher.GroupIdToGroupInfo(groupId)->IsUndefined()");
    if (!bVar9) goto LAB_00f03456;
    *puVar10 = 0;
  }
  TVar3 = *inputOffset;
  CVar1 = (this->super_CharMixin).c;
  pRVar4 = matcher->stats;
  if (pRVar4 != (Type)0x0) {
    pRVar4->numCompares = pRVar4->numCompares + 1;
  }
  uVar11 = *inputOffset;
  if (inputLength < uVar11) {
    inputLength = uVar11;
  }
  while( true ) {
    if (pRVar4 != (Type)0x0) {
      pRVar4->numCompares = pRVar4->numCompares + 1;
    }
    if ((inputLength == uVar11) || (input[uVar11] != CVar1)) break;
    uVar11 = uVar11 + 1;
    *inputOffset = uVar11;
  }
  if ((this->super_NoNeedToSaveMixin).noNeedToSave == false) {
    if ((contStack->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).
        super_ContinuousPageStack<1UL>.bufferSize -
        (contStack->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).
        super_ContinuousPageStack<1UL>.nextTop < 0x18) {
      ContinuousPageStack<1UL>::Resize((ContinuousPageStack<1UL> *)contStack,0x18);
    }
    if ((contStack->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).
        super_ContinuousPageStack<1UL>.bufferSize == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar10 = 1;
      bVar9 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/ContinuousPageStack.h"
                         ,199,"(bufferSize)","bufferSize");
      if (!bVar9) goto LAB_00f03456;
      *puVar10 = 0;
    }
    pPVar5 = (contStack->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).
             super_ContinuousPageStack<1UL>.pageAllocation;
    sVar6 = (contStack->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).
            super_ContinuousPageStack<1UL>.nextTop;
    (contStack->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).
    super_ContinuousPageStack<1UL>.nextTop = sVar6 + 0x18;
    *(size_t *)((long)&pPVar5[1].pageCount + sVar6) =
         (contStack->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).
         topElementSize;
    (contStack->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).topElementSize
         = 0x18;
    iVar2 = (this->super_GroupMixin).groupId;
    *(undefined1 *)((long)&pPVar5[2].pageCount + sVar6) = 3;
    *(undefined ***)((long)&pPVar5[1].segment + sVar6) = &PTR_Print_015597e8;
    *(int *)((long)&pPVar5[2].pageCount + sVar6 + 4) = iVar2;
    Matcher::PushStats(matcher,contStack,input);
  }
  iVar2 = (this->super_GroupMixin).groupId;
  lVar12 = (long)iVar2;
  if ((lVar12 < 0) || ((int)(uint)((matcher->program).ptr)->numGroups <= iVar2)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar10 = 1;
    bVar9 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexRuntime.h"
                       ,0x782,"(groupId >= 0 && groupId < program->numGroups)",
                       "groupId >= 0 && groupId < program->numGroups");
    if (!bVar9) {
LAB_00f03456:
      pcVar8 = (code *)invalidInstructionException();
      (*pcVar8)();
    }
    *puVar10 = 0;
  }
  pGVar7 = (matcher->groupInfos).ptr;
  pGVar7[lVar12].offset = TVar3;
  pGVar7[lVar12].length = *inputOffset - TVar3;
  *instPointer = *instPointer + 8;
  return false;
}

Assistant:

inline bool ChompCharGroupInst<Mode>::Exec(REGEX_INST_EXEC_PARAMETERS) const
    {
        Assert(matcher.GroupIdToGroupInfo(groupId)->IsUndefined());

        const CharCount inputStartOffset = inputOffset;
        const Char matchC = c;
#if ENABLE_REGEX_CONFIG_OPTIONS
        matcher.CompStats();
#endif
        if(Mode == ChompMode::Star || (inputOffset < inputLength && input[inputOffset] == matchC))
        {
            while (true)
            {
                if (Mode != ChompMode::Star)
                {
                    ++inputOffset;
                }
#if ENABLE_REGEX_CONFIG_OPTIONS
                matcher.CompStats();
#endif
                if (inputOffset < inputLength && input[inputOffset] == matchC)
                {
                    if (Mode == ChompMode::Star)
                    {
                        ++inputOffset;
                    }
                    continue;
                }
                break;
            }

            if (!noNeedToSave)
            {
                // UNDO ACTION: Restore group on backtrack
                PUSH(contStack, ResetGroupCont, groupId);
#if ENABLE_REGEX_CONFIG_OPTIONS
                matcher.PushStats(contStack, input);
#endif
            }

            GroupInfo *const groupInfo = matcher.GroupIdToGroupInfo(groupId);
            groupInfo->offset = inputStartOffset;
            groupInfo->length = inputOffset - inputStartOffset;

            instPointer += sizeof(*this);
            return false;
        }

        return matcher.Fail(FAIL_PARAMETERS);
    }